

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O2

uchar * extract_message(uint *c1,uint c_len,uint t,uint *output_len)

{
  uchar *s;
  uchar *puVar1;
  
  s = vector_to_str(c1,c_len);
  puVar1 = substring(s,t * 2,c_len - 1,output_len);
  free(s);
  return puVar1;
}

Assistant:

uint8_t *extract_message(uint32_t *c1, uint32_t c_len, uint32_t t, uint32_t *output_len)
{
    uint8_t *M = vector_to_str(c1, c_len);
    uint8_t *ret = substring(M, 2 * t, c_len - 1, output_len);
    free(M);
    return ret;
}